

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_NtkCollapse_rec(Cba_Ntk_t *pNew,Cba_Ntk_t *p,Vec_Int_t *vSigs)

{
  long lVar1;
  char cVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  int x;
  long lVar8;
  Cba_Ntk_t *p_00;
  char *__assertion;
  ulong uVar9;
  int iVar10;
  long lVar11;
  
  uVar5 = (p->vObjType).nCap;
  if ((p->vObjCopy).nCap < (int)uVar5) {
    piVar7 = (p->vObjCopy).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar5 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar5 << 2);
    }
    (p->vObjCopy).pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_00336421;
    (p->vObjCopy).nCap = uVar5;
  }
  if (0 < (int)uVar5) {
    memset((p->vObjCopy).pArray,0xff,(ulong)uVar5 * 4);
  }
  (p->vObjCopy).nSize = uVar5;
  uVar5 = (p->vFonObj).nCap;
  if ((p->vFonCopy).nCap < (int)uVar5) {
    piVar7 = (p->vFonCopy).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar5 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar5 << 2);
    }
    (p->vFonCopy).pArray = piVar7;
    if (piVar7 == (int *)0x0) {
LAB_00336421:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vFonCopy).nCap = uVar5;
  }
  if (0 < (int)uVar5) {
    memset((p->vFonCopy).pArray,0,(ulong)uVar5 * 4);
  }
  (p->vFonCopy).nSize = uVar5;
  if (vSigs->nSize != (p->vInputs).nSize) {
    __assert_fail("Vec_IntSize(vSigs) == Cba_NtkPiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                  ,0x2e3,"void Cba_NtkCollapse_rec(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *)");
  }
  if (0 < (p->vInputs).nSize) {
    piVar7 = (p->vInputs).pArray;
    lVar8 = 0;
    do {
      iVar6 = piVar7[lVar8];
      if ((long)iVar6 < 1) {
LAB_00336367:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x155,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
      }
      if (((p->vObjFon0).nSize <= iVar6) || (vSigs->nSize <= lVar8)) goto LAB_003362e2;
      uVar5 = (p->vObjFon0).pArray[iVar6];
      if ((int)uVar5 < 1) goto LAB_0033630a;
      if ((p->vFonCopy).nSize <= (int)uVar5) goto LAB_003362e2;
      piVar3 = (p->vFonCopy).pArray;
      if (piVar3[uVar5] != 0) goto LAB_00336301;
      piVar3[uVar5] = vSigs->pArray[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vInputs).nSize);
  }
  if (1 < (p->vObjType).nSize) {
    lVar8 = 1;
    do {
      if ((p->vObjType).nSize <= lVar8) goto LAB_00336386;
      cVar2 = (p->vObjType).pArray[lVar8];
      if (cVar2 != '\0') {
        if ((byte)(cVar2 + 0xa6U) < 0xaa) {
          if (cVar2 == '\x03') {
            if (((p->vObjFon0).nSize <= lVar8) || ((long)(p->vObjFon0).nSize <= lVar8 + 1))
            goto LAB_003362e2;
            uVar5 = (p->vObjFon0).pArray[lVar8];
            uVar9 = (ulong)uVar5;
            while ((int)uVar9 < (p->vObjFon0).pArray[lVar8 + 1]) {
              uVar4 = Cba_ObjAlloc(pNew,CBA_BOX_BUF,1,1);
              if ((int)uVar4 < 1) goto LAB_00336367;
              if ((pNew->vObjFon0).nSize <= (int)uVar4) goto LAB_003362e2;
              if ((int)uVar5 < 1) goto LAB_0033630a;
              if ((p->vFonCopy).nSize <= (int)uVar9) goto LAB_003362e2;
              piVar7 = (p->vFonCopy).pArray;
              if (piVar7[uVar9] != 0) goto LAB_00336301;
              piVar7[uVar9] = (pNew->vObjFon0).pArray[uVar4];
              uVar9 = uVar9 + 1;
              if ((long)(p->vObjFon0).nSize <= lVar8 + 1) goto LAB_003362e2;
            }
          }
        }
        else {
          iVar6 = (int)lVar8;
          uVar5 = Cba_ObjDup(pNew,p,iVar6);
          if (((p->vObjFon0).nSize <= lVar8) || (lVar1 = lVar8 + 1, (p->vObjFon0).nSize <= lVar1))
          goto LAB_003362e2;
          piVar7 = (p->vObjFon0).pArray;
          uVar4 = piVar7[lVar8];
          uVar9 = (ulong)uVar4;
          iVar10 = 0;
          while ((int)uVar9 < piVar7[lVar8 + 1]) {
            if ((int)uVar5 < 1) {
              __assert_fail("i>0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                            ,0x157,"int Cba_ObjFon(Cba_Ntk_t *, int, int)");
            }
            if ((pNew->vObjFon0).nSize <= (int)uVar5) goto LAB_003362e2;
            if ((int)uVar4 < 1) goto LAB_0033630a;
            if ((p->vFonCopy).nSize <= (int)uVar9) goto LAB_003362e2;
            piVar3 = (p->vFonCopy).pArray;
            if (piVar3[uVar9] != 0) goto LAB_00336301;
            piVar3[uVar9] = (pNew->vObjFon0).pArray[uVar5] + iVar10;
            uVar9 = uVar9 + 1;
            iVar10 = iVar10 + 1;
            if ((p->vObjFon0).nSize <= lVar1) goto LAB_003362e2;
          }
          if (0 < (p->vObjAttr).nSize) {
            Vec_IntFillExtra(&p->vObjAttr,(int)lVar1,0);
            if ((p->vObjAttr).nSize <= lVar8) goto LAB_003362e2;
            if ((p->vObjAttr).pArray[lVar8] != 0) {
              piVar7 = Cba_ObjAttrArray(p,iVar6);
              iVar6 = Cba_ObjAttrSize(p,iVar6);
              Cba_ObjSetAttrs(pNew,uVar5,piVar7,iVar6);
            }
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vObjType).nSize);
  }
  if (1 < (p->vObjType).nSize) {
    lVar8 = 1;
    do {
      if ((p->vObjType).nSize <= lVar8) {
LAB_00336386:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      cVar2 = (p->vObjType).pArray[lVar8];
      if (cVar2 != '\0') {
        if ((byte)(cVar2 + 0xa6U) < 0xaa) {
          if (cVar2 == '\x03') {
            vSigs->nSize = 0;
            if (((p->vObjFin0).nSize <= lVar8) || (lVar1 = lVar8 + 1, (p->vObjFin0).nSize <= lVar1))
            goto LAB_003362e2;
            uVar5 = (p->vObjFin0).pArray[lVar8];
            uVar9 = (ulong)uVar5;
            while( true ) {
              piVar7 = (p->vObjFin0).pArray;
              iVar6 = piVar7[lVar8 + 1];
              if (iVar6 <= (int)uVar9) break;
              if ((int)uVar5 < 1) goto LAB_00336329;
              if ((p->vFinFon).nSize <= (int)uVar9) goto LAB_003362e2;
              iVar6 = (p->vFinFon).pArray[uVar9];
              if (0 < (long)iVar6) {
                if ((p->vFonCopy).nSize <= iVar6) goto LAB_003362e2;
                iVar6 = (p->vFonCopy).pArray[iVar6];
              }
              Vec_IntPush(vSigs,iVar6);
              uVar9 = uVar9 + 1;
              if ((p->vObjFin0).nSize <= lVar1) goto LAB_003362e2;
            }
            if (vSigs->nSize != iVar6 - piVar7[lVar8]) {
              __assert_fail("Vec_IntSize(vSigs) == Cba_ObjFinNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                            ,0x305,"void Cba_NtkCollapse_rec(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *)"
                           );
            }
            if ((p->vObjType).nSize <= lVar8) goto LAB_00336386;
            uVar5 = 0;
            if (((p->vObjType).pArray[lVar8] == '\x03') && (uVar5 = 0, 0 < (p->vObjFunc).nSize)) {
              Vec_IntFillExtra(&p->vObjFunc,(int)lVar1,0);
              if ((p->vObjFunc).nSize <= lVar8) goto LAB_003362e2;
              uVar5 = (p->vObjFunc).pArray[lVar8];
            }
            if (((int)uVar5 < 1) || ((p->pDesign->vNtks).nSize <= (int)uVar5)) {
              p_00 = (Cba_Ntk_t *)0x0;
            }
            else {
              p_00 = (Cba_Ntk_t *)(p->pDesign->vNtks).pArray[uVar5];
            }
            Cba_NtkCollapse_rec(pNew,p_00,vSigs);
            if ((p->vObjFon0).nSize <= lVar1) goto LAB_003362e2;
            piVar7 = (p->vObjFon0).pArray;
            uVar5 = piVar7[lVar8];
            if (vSigs->nSize != piVar7[lVar8 + 1] - uVar5) {
              __assert_fail("Vec_IntSize(vSigs) == Cba_ObjFonNum(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaNtk.c"
                            ,0x307,"void Cba_NtkCollapse_rec(Cba_Ntk_t *, Cba_Ntk_t *, Vec_Int_t *)"
                           );
            }
            if ((p->vObjFon0).nSize <= lVar1) goto LAB_003362e2;
            lVar11 = 0;
            while( true ) {
              uVar9 = (ulong)uVar5 + lVar11;
              uVar4 = (uint)uVar9;
              if ((p->vObjFon0).pArray[lVar8 + 1] <= (int)uVar4) break;
              if (0 < (int)uVar4) {
                if ((p->vFonCopy).nSize <= (int)uVar4) goto LAB_003362e2;
                uVar4 = (p->vFonCopy).pArray[uVar9 & 0xffffffff];
              }
              if ((int)uVar4 < 1) {
                iVar6 = 0;
              }
              else {
                if ((pNew->vFonObj).nSize <= (int)uVar4) goto LAB_003362e2;
                iVar6 = (pNew->vFonObj).pArray[uVar4];
              }
              if (vSigs->nSize <= lVar11) goto LAB_003362e2;
              Cba_ObjSetFinFon(pNew,iVar6,0,vSigs->pArray[lVar11]);
              lVar11 = lVar11 + 1;
              if ((p->vObjFon0).nSize <= lVar1) goto LAB_003362e2;
            }
          }
        }
        else {
          if ((p->vObjCopy).nSize < 1) {
            __assert_fail("Cba_NtkHasObjCopies(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                          ,0x15b,"int Cba_ObjCopy(Cba_Ntk_t *, int)");
          }
          lVar1 = lVar8 + 1;
          Vec_IntFillExtra(&p->vObjCopy,(int)lVar1,-1);
          if ((((p->vObjCopy).nSize <= lVar8) || ((p->vObjFin0).nSize <= lVar8)) ||
             ((p->vObjFin0).nSize <= lVar1)) goto LAB_003362e2;
          iVar6 = (p->vObjCopy).pArray[lVar8];
          uVar5 = (p->vObjFin0).pArray[lVar8];
          uVar9 = (ulong)uVar5;
          iVar10 = 0;
          while ((int)uVar9 < (p->vObjFin0).pArray[lVar8 + 1]) {
            if ((int)uVar5 < 1) goto LAB_00336329;
            if ((p->vFinFon).nSize <= (int)uVar9) goto LAB_003362e2;
            x = (p->vFinFon).pArray[uVar9];
            if (0 < (long)x) {
              if ((p->vFonCopy).nSize <= x) goto LAB_003362e2;
              x = (p->vFonCopy).pArray[x];
            }
            Cba_ObjSetFinFon(pNew,iVar6,iVar10,x);
            uVar9 = uVar9 + 1;
            iVar10 = iVar10 + 1;
            if ((p->vObjFin0).nSize <= lVar1) goto LAB_003362e2;
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vObjType).nSize);
  }
  vSigs->nSize = 0;
  if (0 < (p->vOutputs).nSize) {
    lVar8 = 0;
    do {
      iVar6 = (p->vOutputs).pArray[lVar8];
      if ((long)iVar6 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x16b,"int Cba_ObjFinFon(Cba_Ntk_t *, int, int)");
      }
      if ((p->vObjFin0).nSize <= iVar6) {
LAB_003362e2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = (p->vObjFin0).pArray[iVar6];
      if ((long)iVar6 < 1) {
LAB_00336329:
        __assert_fail("f>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                      ,0x169,"int Cba_FinFon(Cba_Ntk_t *, int)");
      }
      if ((p->vFinFon).nSize <= iVar6) goto LAB_003362e2;
      iVar6 = (p->vFinFon).pArray[iVar6];
      if (0 < (long)iVar6) {
        if ((p->vFonCopy).nSize <= iVar6) goto LAB_003362e2;
        iVar6 = (p->vFonCopy).pArray[iVar6];
      }
      Vec_IntPush(vSigs,iVar6);
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vOutputs).nSize);
  }
  return;
LAB_0033630a:
  __assertion = "Cba_FonIsReal(f)";
  goto LAB_00336311;
LAB_00336301:
  __assertion = "Cba_FonCopy(p, f) == 0";
LAB_00336311:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                ,0x189,"void Cba_FonSetCopy(Cba_Ntk_t *, int, int)");
}

Assistant:

void Cba_NtkCollapse_rec( Cba_Ntk_t * pNew, Cba_Ntk_t * p, Vec_Int_t * vSigs )
{
    int i, iObj, iObjNew, iFin, iFon;
    Cba_NtkCleanObjCopies( p );
    Cba_NtkCleanFonCopies( p );
    // set PI copies
    assert( Vec_IntSize(vSigs) == Cba_NtkPiNum(p) );
    Cba_NtkForEachPiFon( p, iObj, iFon, i )
        Cba_FonSetCopy( p, iFon, Vec_IntEntry(vSigs, i) );
    // duplicate primitives and create buffers for user instances
    Cba_NtkForEachObj( p, iObj )
        if ( Cba_ObjIsBoxPrim( p, iObj ) )
        {
            iObjNew = Cba_ObjDup( pNew, p, iObj );
            Cba_ObjForEachFon( p, iObj, iFon, i )
                Cba_FonSetCopy( p, iFon, Cba_ObjFon(pNew, iObjNew, i) );
            if ( Cba_ObjAttr(p, iObj) )
                Cba_ObjSetAttrs( pNew, iObjNew, Cba_ObjAttrArray(p, iObj), Cba_ObjAttrSize(p, iObj) );
        }
        else if ( Cba_ObjIsBoxUser( p, iObj ) )
        {
            Cba_ObjForEachFon( p, iObj, iFon, i )
            {
                iObjNew = Cba_ObjAlloc( pNew, CBA_BOX_BUF, 1, 1 );
                Cba_FonSetCopy( p, iFon, Cba_ObjFon0(pNew, iObjNew) );
            }
        }
    // connect primitives and collapse user instances
    Cba_NtkForEachObj( p, iObj )
        if ( Cba_ObjIsBoxPrim( p, iObj ) )
        {
            iObjNew = Cba_ObjCopy( p, iObj );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, i )
                Cba_ObjSetFinFon( pNew, iObjNew, i, Cba_FonCopy(p, iFon) );
        }
        else if ( Cba_ObjIsBoxUser( p, iObj ) )
        {
            Vec_IntClear( vSigs );
            Cba_ObjForEachFinFon( p, iObj, iFin, iFon, i )
                Vec_IntPush( vSigs, Cba_FonCopy(p, iFon) );
            assert( Vec_IntSize(vSigs) == Cba_ObjFinNum(p, iObj) );
            Cba_NtkCollapse_rec( pNew, Cba_ObjNtk(p, iObj), vSigs );
            assert( Vec_IntSize(vSigs) == Cba_ObjFonNum(p, iObj) );
            Cba_ObjForEachFon( p, iObj, iFon, i )
            {
                iObjNew = Cba_FonObj( pNew, Cba_FonCopy(p, iFon) ); // buffer
                Cba_ObjSetFinFon( pNew, iObjNew, 0, Vec_IntEntry(vSigs, i) );
            }
        }
    // collect POs
    Vec_IntClear( vSigs );
    Cba_NtkForEachPoDriverFon( p, iObj, iFon, i )
        Vec_IntPush( vSigs, Cba_FonCopy(p, iFon) );
}